

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotation_test_util.cc
# Opt level: O2

bool google::protobuf::compiler::annotation_test_util::RunProtoCompiler
               (string *filename,string *plugin_specific_args,CommandLineInterface *cli,
               FileDescriptorProto *file)

{
  int iVar1;
  string capture_out;
  DescriptorCapturingGenerator capturing_generator;
  char *argv [5];
  char *local_90;
  AlphaNum *local_88;
  string proto_path;
  AlphaNum local_50;
  
  capturing_generator.super_CodeGenerator._vptr_CodeGenerator =
       (_func_int **)&PTR__CodeGenerator_0053a350;
  capturing_generator.file_ = file;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)argv,"--capture_out",(allocator<char> *)&proto_path);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"",(allocator<char> *)&capture_out);
  CommandLineInterface::RegisterGenerator
            (cli,(string *)argv,&capturing_generator.super_CodeGenerator,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)argv);
  argv._0_16_ = (undefined1  [16])absl::lts_20250127::NullSafeStringView("-I");
  TestTempDir_abi_cxx11_();
  local_50.piece_._M_len = capture_out._M_string_length;
  local_50.piece_._M_str = capture_out._M_dataplus._M_p;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&proto_path,(lts_20250127 *)argv,&local_50,(AlphaNum *)capture_out._M_string_length);
  std::__cxx11::string::~string((string *)&capture_out);
  argv._0_16_ = (undefined1  [16])absl::lts_20250127::NullSafeStringView("--capture_out=");
  TestTempDir_abi_cxx11_();
  local_50.piece_._M_len = (size_t)local_88;
  local_50.piece_._M_str = local_90;
  absl::lts_20250127::StrCat_abi_cxx11_(&capture_out,(lts_20250127 *)argv,&local_50,local_88);
  std::__cxx11::string::~string((string *)&local_90);
  argv[1] = proto_path._M_dataplus._M_p;
  argv[0] = "protoc";
  argv[2] = (plugin_specific_args->_M_dataplus)._M_p;
  argv[3] = capture_out._M_dataplus._M_p;
  argv[4] = (filename->_M_dataplus)._M_p;
  iVar1 = CommandLineInterface::Run(cli,5,argv);
  std::__cxx11::string::~string((string *)&capture_out);
  std::__cxx11::string::~string((string *)&proto_path);
  CodeGenerator::~CodeGenerator(&capturing_generator.super_CodeGenerator);
  return iVar1 == 0;
}

Assistant:

bool RunProtoCompiler(const std::string& filename,
                      const std::string& plugin_specific_args,
                      CommandLineInterface* cli, FileDescriptorProto* file) {
  cli->SetInputsAreProtoPathRelative(true);

  DescriptorCapturingGenerator capturing_generator(file);
  cli->RegisterGenerator("--capture_out", &capturing_generator, "");

  std::string proto_path = absl::StrCat("-I", TestTempDir());
  std::string capture_out = absl::StrCat("--capture_out=", TestTempDir());

  const char* argv[] = {"protoc", proto_path.c_str(),
                        plugin_specific_args.c_str(), capture_out.c_str(),
                        filename.c_str()};

  return cli->Run(5, argv) == 0;
}